

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

void __thiscall
ParamListStandard::forceNoUse(ParamListStandard *this,ParamActive *active,int4 start,int4 stop)

{
  bool bVar1;
  bool bVar2;
  int4 iVar3;
  int4 iVar4;
  ParamTrial *this_00;
  ParamEntry *pPVar5;
  int4 grp;
  ParamTrial *curtrial;
  int4 i;
  bool alldefnouse;
  bool exclusion;
  int4 curgroup;
  bool seendefnouse;
  int4 stop_local;
  int4 start_local;
  ParamActive *active_local;
  ParamListStandard *this_local;
  
  bVar1 = false;
  i = -1;
  curtrial._6_1_ = false;
  for (curtrial._0_4_ = start; (int4)curtrial < stop; curtrial._0_4_ = (int4)curtrial + 1) {
    this_00 = ParamActive::getTrial(active,(int4)curtrial);
    pPVar5 = ParamTrial::getEntry(this_00);
    if (pPVar5 != (ParamEntry *)0x0) {
      pPVar5 = ParamTrial::getEntry(this_00);
      iVar3 = ParamEntry::getGroup(pPVar5);
      pPVar5 = ParamTrial::getEntry(this_00);
      bVar2 = ParamEntry::isExclusion(pPVar5);
      if ((i < iVar3) || (!bVar2)) {
        if (curtrial._6_1_ != false) {
          bVar1 = true;
        }
        curtrial._6_1_ = ParamTrial::isDefinitelyNotUsed(this_00);
        pPVar5 = ParamTrial::getEntry(this_00);
        iVar4 = ParamEntry::getGroupSize(pPVar5);
        i = iVar3 + iVar4 + -1;
      }
      else {
        bVar2 = ParamTrial::isDefinitelyNotUsed(this_00);
        if (!bVar2) {
          curtrial._6_1_ = false;
        }
      }
      if (bVar1) {
        ParamTrial::markInactive(this_00);
      }
    }
  }
  return;
}

Assistant:

void ParamListStandard::forceNoUse(ParamActive *active, int4 start, int4 stop) const

{
  bool seendefnouse = false;
  int4 curgroup = -1;
  bool exclusion = false;
  bool alldefnouse = false;
  for (int4 i = start; i < stop; ++i) {
    ParamTrial &curtrial(active->getTrial(i));
    if (curtrial.getEntry() == (const ParamEntry *) 0)
      continue;	// Already marked as not used
    int4 grp = curtrial.getEntry()->getGroup();
    exclusion = curtrial.getEntry()->isExclusion();
    if ((grp <= curgroup) && exclusion) {// If in the same exclusion group
      if (!curtrial.isDefinitelyNotUsed()) // A single element that might be used
	alldefnouse = false; // means that the whole group might be used
    }
    else { // First trial in a new group (or next element in same non-exclusion group)
      if (alldefnouse)	   // If all in the last group were defnotused
	seendefnouse = true;// then force everything afterword to be defnotused
      alldefnouse = curtrial.isDefinitelyNotUsed();
      curgroup = grp + curtrial.getEntry()->getGroupSize() - 1;
    }
    if (seendefnouse)
      curtrial.markInactive();
  }
}